

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

_Bool next_value_greater_than_reporting_level_upper_bound
                (hdr_iter *iter,int64_t reporting_level_upper_bound)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  long in_RDX;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  bVar2 = false;
  if ((int)reporting_level_upper_bound < (int)iter->value_iterated_to) {
    uVar4 = (int)reporting_level_upper_bound + 1;
    iVar5 = (int)uVar4 >> ((byte)iter->count & 0x1f);
    cVar3 = (char)iVar5 + -1;
    iVar6 = *(int *)((long)&iter->count + 4);
    uVar1 = iVar6 - 1;
    if (iVar5 < 1) {
      cVar3 = '\0';
      iVar6 = 0;
    }
    bVar2 = in_RDX < (long)(int)(iVar6 + (uVar1 & uVar4)) <<
                     (cVar3 + (char)(int)iter->total_count & 0x3fU);
  }
  return bVar2;
}

Assistant:

static bool next_value_greater_than_reporting_level_upper_bound(
    struct hdr_iter *iter, int64_t reporting_level_upper_bound)
{
    if (iter->counts_index >= iter->h->counts_len)
    {
        return false;
    }

    return peek_next_value_from_index(iter) > reporting_level_upper_bound;
}